

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O0

bool __thiscall
Assimp::OpenGEX::OpenGEXImporter::CanRead
          (OpenGEXImporter *this,string *file,IOSystem *pIOHandler,bool checkSig)

{
  bool local_22;
  bool canRead;
  bool checkSig_local;
  IOSystem *pIOHandler_local;
  string *file_local;
  OpenGEXImporter *this_local;
  
  if (checkSig) {
    local_22 = BaseImporter::SearchFileHeaderForToken
                         (pIOHandler,file,CanRead::token,4,200,false,false);
  }
  else {
    local_22 = BaseImporter::SimpleExtensionCheck(file,"ogex",(char *)0x0,(char *)0x0);
  }
  return local_22;
}

Assistant:

bool OpenGEXImporter::CanRead( const std::string &file, IOSystem *pIOHandler, bool checkSig ) const {
    bool canRead( false );
    if( !checkSig ) {
        canRead = SimpleExtensionCheck( file, "ogex" );
    } else {
        static const char *token[] = { "Metric", "GeometryNode", "VertexArray (attrib", "IndexArray" };
        canRead = BaseImporter::SearchFileHeaderForToken( pIOHandler, file, token, 4 );
    }

    return canRead;
}